

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

void __thiscall Sudoku::Sudoku(Sudoku *this,int size,SudokuType type)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  Field *this_00;
  pointer *__ptr;
  uint pos_x;
  uint uVar5;
  ulong uVar6;
  _Head_base<0UL,_Field_*,_false> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *local_38;
  
  this->_vptr_Sudoku = (_func_int **)&PTR_print_001289b0;
  local_38 = &this->furtherWays_;
  (this->fields_).
  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fields_).
  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fields_).
  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_begin_)._M_current = (shared_ptr<Field> *)0x0;
  (this->field_end_)._M_current = (shared_ptr<Field> *)0x0;
  (this->furtherWays_).super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_38;
  (this->furtherWays_).super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_38;
  (this->furtherWays_).super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>.
  _M_impl._M_node._M_size = 0;
  this->type_ = type;
  this->size_ = size;
  this->squared_size_ = size * size;
  this->current_z_ = 0;
  local_40 = &this->filename_;
  local_48 = &(this->filename_).field_2;
  (this->filename_)._M_dataplus._M_p = (pointer)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"out.txt","");
  local_50 = &(this->solutionHints_).field_2;
  (this->solutionHints_)._M_dataplus._M_p = (pointer)local_50;
  (this->solutionHints_)._M_string_length = 0;
  (this->solutionHints_).field_2._M_local_buf[0] = '\0';
  (this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::resize
            (&this->fields_,(ulong)(uint)(this->squared_size_ * this->squared_size_));
  iVar4 = this->squared_size_;
  if (0 < iVar4) {
    pos_x = 0;
    do {
      if (0 < iVar4) {
        uVar6 = 0;
        do {
          this_00 = (Field *)operator_new(0xd8);
          iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)pos_x,uVar6);
          Field::Field(this_00,iVar4,pos_x,(int)uVar6,this->current_z_,this->squared_size_);
          local_58._M_head_impl = this_00;
          iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)pos_x,uVar6);
          std::__shared_ptr<Field,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<Field,(__gnu_cxx::_Lock_policy)2> *)
                     ((this->fields_).
                      super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar4),
                     (unique_ptr<Field,_std::default_delete<Field>_> *)&local_58);
          if (local_58._M_head_impl != (Field *)0x0) {
            std::default_delete<Field>::operator()
                      ((default_delete<Field> *)&local_58,local_58._M_head_impl);
          }
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
          iVar4 = this->squared_size_;
        } while ((int)uVar5 < iVar4);
      }
      pos_x = pos_x + 1;
    } while ((int)pos_x < iVar4);
  }
  uVar1 = *(undefined4 *)
           ((long)&(this->fields_).
                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4);
  uVar2 = *(undefined4 *)
           &(this->fields_).
            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = *(undefined4 *)
           ((long)&(this->fields_).
                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 4);
  *(undefined4 *)&(this->field_begin_)._M_current =
       *(undefined4 *)
        &(this->fields_).
         super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)((long)&(this->field_begin_)._M_current + 4) = uVar1;
  *(undefined4 *)&(this->field_end_)._M_current = uVar2;
  *(undefined4 *)((long)&(this->field_end_)._M_current + 4) = uVar3;
  (*this->_vptr_Sudoku[8])(this);
  return;
}

Assistant:

Sudoku::Sudoku(int size, SudokuType type) : type_(type), size_(size), squared_size_(size*size), current_z_(0), filename_("out.txt")
{
  fields_.resize(squared_size_*squared_size_);

  //srand(std::time(NULL));

  //create fields
  for(int x = 0; x < squared_size_; x++)
  {
    for (int y = 0; y < squared_size_; y++)
    {
      fields_[index(x,y)] = std::move(std::unique_ptr<Field>(new Field(index(x,y),x,y,current_z_,squared_size_)));
    }
  }
  /*
  unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
  std::shuffle(fields_.begin(), fields_.end(), std::default_random_engine(seed));
  */

  field_begin_= fields_.begin();
  field_end_ = fields_.end();
  addDependencies();
}